

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::activate_argument_buffer_resources(CompilerMSL *this)

{
  ParsedIR *this_00;
  ID id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  long lVar5;
  LoopLock LStack_38;
  
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar5 = 0; sVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
    id.id = *(uint32_t *)((long)&pTVar1->id + lVar5);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id.id].type == TypeVariable) {
      ParsedIR::get<spirv_cross::SPIRVariable>(this_00,id.id);
      bVar3 = Compiler::has_decoration((Compiler *)this,id,DecorationDescriptorSet);
      if (bVar3) {
        uVar4 = Compiler::get_decoration((Compiler *)this,id,DecorationDescriptorSet);
        if (((uVar4 < 8) && ((this->msl_options).argument_buffers != false)) &&
           ((this->argument_buffer_discrete_mask >> (uVar4 & 0x1f) & 1) == 0)) {
          Compiler::add_active_interface_variable((Compiler *)this,id.id);
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&LStack_38);
  return;
}

Assistant:

void CompilerMSL::activate_argument_buffer_resources()
{
	// For ABI compatibility, force-enable all resources which are part of argument buffers.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t self, const SPIRVariable &) {
		if (!has_decoration(self, DecorationDescriptorSet))
			return;

		uint32_t desc_set = get_decoration(self, DecorationDescriptorSet);
		if (descriptor_set_is_argument_buffer(desc_set))
			add_active_interface_variable(self);
	});
}